

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# eigrp-packet.cc
# Opt level: O1

void __thiscall EigrpPacket::Print(EigrpPacket *this,ostream *os)

{
  pointer psVar1;
  element_type *peVar2;
  char cVar3;
  ostream *poVar4;
  shared_ptr<Tlv> *var;
  pointer psVar5;
  char local_31 [9];
  
  std::__ostream_insert<char,std::char_traits<char>>(os,"Eigrp Packet:",0xd);
  local_31[0] = '\n';
  std::__ostream_insert<char,std::char_traits<char>>(os,local_31,1);
  local_31[1] = 9;
  poVar4 = std::__ostream_insert<char,std::char_traits<char>>(os,local_31 + 1,1);
  std::__ostream_insert<char,std::char_traits<char>>(poVar4,"opcode: ",8);
  poVar4 = std::ostream::_M_insert<unsigned_long>((ulong)poVar4);
  local_31[2] = 10;
  std::__ostream_insert<char,std::char_traits<char>>(poVar4,local_31 + 2,1);
  local_31[3] = 9;
  poVar4 = std::__ostream_insert<char,std::char_traits<char>>(os,local_31 + 3,1);
  std::__ostream_insert<char,std::char_traits<char>>(poVar4,"flags: ",7);
  poVar4 = std::ostream::_M_insert<unsigned_long>((ulong)poVar4);
  local_31[4] = 10;
  std::__ostream_insert<char,std::char_traits<char>>(poVar4,local_31 + 4,1);
  local_31[5] = 9;
  poVar4 = std::__ostream_insert<char,std::char_traits<char>>(os,local_31 + 5,1);
  std::__ostream_insert<char,std::char_traits<char>>(poVar4,"virtual router id: ",0x13);
  poVar4 = std::ostream::_M_insert<unsigned_long>((ulong)poVar4);
  local_31[6] = 10;
  std::__ostream_insert<char,std::char_traits<char>>(poVar4,local_31 + 6,1);
  local_31[7] = 9;
  poVar4 = std::__ostream_insert<char,std::char_traits<char>>(os,local_31 + 7,1);
  std::__ostream_insert<char,std::char_traits<char>>(poVar4,"autonomous system: ",0x13);
  poVar4 = std::ostream::_M_insert<unsigned_long>((ulong)poVar4);
  local_31[8] = 10;
  std::__ostream_insert<char,std::char_traits<char>>(poVar4,local_31 + 8,1);
  cVar3 = (char)os;
  std::ios::widen((char)*(undefined8 *)(*(long *)os + -0x18) + cVar3);
  std::ostream::put(cVar3);
  std::ostream::flush();
  psVar1 = (this->tlvs).
           super__Vector_base<std::shared_ptr<Tlv>,_std::allocator<std::shared_ptr<Tlv>_>_>._M_impl.
           super__Vector_impl_data._M_finish;
  for (psVar5 = (this->tlvs).
                super__Vector_base<std::shared_ptr<Tlv>,_std::allocator<std::shared_ptr<Tlv>_>_>.
                _M_impl.super__Vector_impl_data._M_start; psVar5 != psVar1; psVar5 = psVar5 + 1) {
    peVar2 = (psVar5->super___shared_ptr<Tlv,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
    (*peVar2->_vptr_Tlv[2])(peVar2,os);
  }
  std::ios::widen((char)*(undefined8 *)(*(long *)os + -0x18) + cVar3);
  std::ostream::put(cVar3);
  std::ostream::flush();
  return;
}

Assistant:

void EigrpPacket::Print(std::ostream& os)
{
    os << "Eigrp Packet:" << '\n';
    os << '\t' << "opcode: " << (uint16_t)opcode << '\n';
    os << '\t' << "flags: " << flags << '\n';
    os << '\t' << "virtual router id: " << v_router << '\n';
    os << '\t' << "autonomous system: " << as << '\n';
    os << std::endl;

    for (auto& var : tlvs)
    {
        var->Print(os);
    }
    os << std::endl;
}